

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::AssertionHandler::handleExpr<CLI::App_const&>
          (AssertionHandler *this,ExprLhs<const_CLI::App_&> *expr)

{
  ITransientExpression local_20;
  App *local_10;
  
  local_10 = expr->m_lhs;
  local_20.m_result = local_10->parsed_ != 0;
  local_20.m_isBinaryExpression = false;
  local_20._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00275170;
  handleExpr(this,&local_20);
  ITransientExpression::~ITransientExpression(&local_20);
  return;
}

Assistant:

auto makeUnaryExpr() const -> UnaryExpr<LhsT> {
            return UnaryExpr<LhsT>{ m_lhs };
        }